

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::textarea::textarea(textarea *this)

{
  base_widget::base_widget((base_widget *)&(this->super_base_text).field_0x58);
  base_text::base_text(&this->super_base_text,&PTR_construction_vtable_24__002b4b38);
  (this->super_base_text)._vptr_base_text = (_func_int **)0x2b4a60;
  *(undefined8 *)&(this->super_base_text).field_0x58 = 0x2b4ae0;
  *(undefined8 *)&(this->super_base_text).field_0x48 = 0xffffffffffffffff;
  *(undefined8 *)&(this->super_base_text).field_0x50 = 0;
  return;
}

Assistant:

textarea::textarea() : rows_(-1), cols_(-1) {}